

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm83.cpp
# Opt level: O1

void __thiscall SM83::sra_dhl(SM83 *this)

{
  byte bVar1;
  byte value;
  string_view fmt;
  format_args args;
  ulong local_68 [2];
  ulong local_58;
  ulong local_48;
  ulong local_38;
  ulong local_28;
  ulong local_18;
  
  local_68[0] = (ulong)(this->field_0).af;
  local_58 = (ulong)(this->field_1).bc;
  local_48 = (ulong)(this->field_2).de;
  local_38 = (ulong)(this->field_3).hl;
  local_28 = (ulong)this->sp;
  local_18 = (ulong)this->pc_at_opcode;
  fmt.size_ = 0x46;
  fmt.data_ = "AF={:04X} BC={:04X} DE={:04X} HL={:04X} SP={:04X} PC={:04X}  SRA (HL)\n";
  args.field_1.values_ = (value<fmt::v11::context> *)local_68;
  args.desc_ = 0x222222;
  ::fmt::v11::vprint(fmt,args);
  bVar1 = Bus::Read8(this->bus,(this->field_3).hl,true);
  value = bVar1 >> 1 | bVar1 & 0x80;
  (this->field_0).field_1.f = (bVar1 & 1) << 4 | (this->field_0).field_1.f & 0xf | (value == 0) << 7
  ;
  Bus::Write8(this->bus,(this->field_3).hl,value,true);
  return;
}

Assistant:

void SM83::sra_dhl() {
    LTRACE("SRA (HL)");

    u8 value = bus.Read8(hl);
    u8 bit7 = value & (1 << 7);
    u8 result = value >> 1;

    SetZeroFlag((result | bit7) == 0);
    SetNegateFlag(false);
    SetHalfCarryFlag(false);
    SetCarryFlag(value & 0x1);

    bus.Write8(hl, result | bit7);
}